

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

void chacha_test_compact_array(uint8_t *dst,uint8_t *src,size_t srclen)

{
  ulong in_RDX;
  long in_RSI;
  void *in_RDI;
  size_t j;
  size_t i;
  size_t blocks;
  undefined8 local_30;
  undefined8 local_28;
  
  memset(in_RDI,0,0x40);
  for (local_28 = 0; local_28 < in_RDX >> 6; local_28 = local_28 + 1) {
    for (local_30 = 0; local_30 < 0x40; local_30 = local_30 + 1) {
      *(byte *)((long)in_RDI + local_30) =
           *(byte *)((long)in_RDI + local_30) ^ *(byte *)(in_RSI + local_28 * 0x40 + local_30);
    }
  }
  return;
}

Assistant:

static void
chacha_test_compact_array(uint8_t *dst, const uint8_t *src, size_t srclen) {
    size_t blocks = srclen / CHACHA_BLOCKBYTES;
    size_t i, j;
    memset(dst, 0, CHACHA_BLOCKBYTES);
    for (i = 0; i < blocks; i++) {
        for (j = 0; j < CHACHA_BLOCKBYTES; j++)
            dst[j] ^= src[(i * CHACHA_BLOCKBYTES) + j];
    }
}